

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O3

void __thiscall RSA::encrypt(RSA *this,char *__block,int __edflag)

{
  string *this_00;
  _Rb_tree_header *p_Var1;
  char cVar2;
  undefined1 uVar3;
  char *pcVar4;
  char *pcVar5;
  Conversion *pCVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  undefined4 in_register_00000014;
  char *pcVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  BigInt message;
  BigInt cipher;
  set<char,_std::less<char>,_std::allocator<char>_> vocab_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  BigInt local_100;
  string local_e0;
  BigInt local_c0;
  BigInt local_a0;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_80;
  string local_50;
  
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((set<char,std::less<char>,std::allocator<char>> *)&local_80,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__block[8],
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__block[8] + *(long *)(__block + 0x10)));
  std::operator+(&local_120,"_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000014,__edflag));
  this_00 = (string *)(__block + 0x28);
  std::__cxx11::string::operator=(this_00,(string *)&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  pcVar4 = *(char **)(__block + 0x28);
  pcVar5 = *(char **)(__block + 0x30);
  if (pcVar5 != (char *)0x0) {
    if (local_80._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0010499a:
      std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar5,0x10d05a);
      std::__cxx11::string::_M_assign((string *)(__block + 0x48));
      __block[0x178] = '\x01';
      __block[0x179] = '\0';
      __block[0x17a] = '\0';
      __block[0x17b] = '\0';
      if (*(long *)(__block + 0x168) != *(long *)(__block + 0x160)) {
        *(long *)(__block + 0x168) = *(long *)(__block + 0x160);
      }
      (this->super_Crypto)._vptr_Crypto =
           (_func_int **)&(this->super_Crypto).vocabulary._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
      goto LAB_00104a6b;
    }
    p_Var1 = &local_80._M_impl.super__Rb_tree_header;
    pcVar9 = pcVar4;
    do {
      cVar2 = *pcVar9;
      p_Var12 = &p_Var1->_M_header;
      p_Var7 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        p_Var10 = p_Var7;
        p_Var11 = p_Var12;
        uVar3 = (undefined1)p_Var10[1]._M_color;
        p_Var12 = p_Var10;
        if ((char)uVar3 < cVar2) {
          p_Var12 = p_Var11;
        }
        p_Var7 = (&p_Var10->_M_left)[(char)uVar3 < cVar2];
      } while ((&p_Var10->_M_left)[(char)uVar3 < cVar2] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var12 == p_Var1) goto LAB_0010499a;
      if ((char)uVar3 < cVar2) {
        p_Var10 = p_Var11;
      }
      if (cVar2 < (char)p_Var10[1]._M_color) goto LAB_0010499a;
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != pcVar4 + (long)pcVar5);
  }
  pCVar6 = *(Conversion **)(__block + 0x1a0);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,pcVar4,pcVar4 + (long)pcVar5);
  Conversion::convert_to_num_base((BigInt *)&local_120,pCVar6,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  *(undefined4 *)(__block + 0x178) = local_120.field_2._8_4_;
  std::vector<long_long,_std::allocator<long_long>_>::operator=
            ((vector<long_long,_std::allocator<long_long>_> *)(__block + 0x160),
             (vector<long_long,_std::allocator<long_long>_> *)&local_120);
  bVar8 = BigInt::operator<((BigInt *)&local_120,(BigInt *)(__block + 0xe0));
  if (bVar8) {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_a0.vector_value,
               (vector<long_long,_std::allocator<long_long>_> *)(__block + 0x120));
    local_a0.sign = *(int *)(__block + 0x138);
    BigInt::powMod(&local_100,(BigInt *)&local_120,&local_a0,(BigInt *)(__block + 0xe0));
    if (local_a0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    *(int *)(__block + 0x198) = local_100.sign;
    std::vector<long_long,_std::allocator<long_long>_>::operator=
              ((vector<long_long,_std::allocator<long_long>_> *)(__block + 0x180),
               &local_100.vector_value);
    pCVar6 = *(Conversion **)(__block + 0x1a0);
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_c0.vector_value,&local_100.vector_value);
    local_c0.sign = local_100.sign;
    Conversion::convert_to_voacb_base_abi_cxx11_(&local_50,pCVar6,&local_c0);
    std::__cxx11::string::operator=((string *)(__block + 0x48),(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_c0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    (this->super_Crypto)._vptr_Crypto =
         (_func_int **)&(this->super_Crypto).vocabulary._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this,*(long *)(__block + 0x48),
               *(long *)(__block + 0x50) + *(long *)(__block + 0x48));
    if (local_100.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)this_00,0,*(char **)(__block + 0x30),0x10d097);
    std::__cxx11::string::_M_assign((string *)(__block + 0x48));
    __block[0x178] = '\x01';
    __block[0x179] = '\0';
    __block[0x17a] = '\0';
    __block[0x17b] = '\0';
    if (*(long *)(__block + 0x168) != *(long *)(__block + 0x160)) {
      *(long *)(__block + 0x168) = *(long *)(__block + 0x160);
    }
    (this->super_Crypto)._vptr_Crypto =
         (_func_int **)&(this->super_Crypto).vocabulary._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  }
  if (local_120._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_120._M_dataplus._M_p);
  }
LAB_00104a6b:
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_80);
  return;
}

Assistant:

string RSA::encrypt(string pPlainText) {
    set<char> vocab_set(vocabulary.begin(), vocabulary.end());
    plainText = "_" + pPlainText; //! some character may be zero

    for (auto plain_char:plainText)
        if (vocab_set.find(plain_char) == vocab_set.end()) {
            cipherText = plainText = "Some letter in the plain text is not contained in vocabulary";
            plain_BigInt = 0;
            return "";
        }
    BigInt message = conversion->convert_to_num_base(plainText);

    plain_BigInt = message;

    if (message >= n) {
        cipherText = plainText = "The message is to large to fit into n space";
        plain_BigInt = 0;
        return "";
    }

    BigInt cipher = message.powMod(e, n);
    cipher_BigInt = cipher;
    cipherText = conversion->convert_to_voacb_base(cipher);
    return cipherText;
}